

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O1

void refineAndSquareBbox(vector<Bbox,_std::allocator<Bbox>_> *vecBbox,int *height,int *width)

{
  pointer pBVar1;
  iterator it;
  pointer pBVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  pBVar2 = (vecBbox->super__Vector_base<Bbox,_std::allocator<Bbox>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pBVar1 = (vecBbox->super__Vector_base<Bbox,_std::allocator<Bbox>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pBVar2 == pBVar1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Bbox is empty!!",0xf);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
    return;
  }
  do {
    if (pBVar2->exist == true) {
      fVar6 = (float)((pBVar2->x2 - pBVar2->x1) + 1);
      fVar3 = (float)((pBVar2->y2 - pBVar2->y1) + 1);
      fVar5 = pBVar2->regreCoord[1] * fVar6 + (float)pBVar2->x1;
      fVar4 = pBVar2->regreCoord[0] * fVar3 + (float)pBVar2->y1;
      fVar7 = ((fVar6 * pBVar2->regreCoord[3] + (float)pBVar2->x2) - fVar5) + 1.0;
      fVar6 = ((fVar3 * pBVar2->regreCoord[2] + (float)pBVar2->y2) - fVar4) + 1.0;
      fVar3 = fVar7;
      if (fVar7 <= fVar6) {
        fVar3 = fVar6;
      }
      fVar5 = fVar7 * 0.5 + fVar5 + -fVar3 * 0.5;
      fVar6 = fVar6 * 0.5 + fVar4 + -fVar3 * 0.5;
      fVar4 = roundf(fVar3 + fVar5 + -1.0);
      pBVar2->x2 = (int)fVar4;
      fVar3 = roundf(fVar3 + fVar6 + -1.0);
      pBVar2->y2 = (int)fVar3;
      fVar5 = roundf(fVar5);
      pBVar2->x1 = (int)fVar5;
      fVar6 = roundf(fVar6);
      pBVar2->y1 = (int)fVar6;
      if ((int)fVar5 < 0) {
        pBVar2->x1 = 0;
      }
      if ((int)fVar6 < 0) {
        pBVar2->y1 = 0;
      }
      if (*height < (int)fVar4) {
        pBVar2->x2 = *height + -1;
      }
      if (*width < (int)fVar3) {
        pBVar2->y2 = *width + -1;
      }
      pBVar2->area = (float)((pBVar2->y2 - pBVar2->y1) * (pBVar2->x2 - pBVar2->x1));
    }
    pBVar2 = pBVar2 + 1;
  } while (pBVar2 != pBVar1);
  return;
}

Assistant:

void refineAndSquareBbox(vector<struct Bbox> &vecBbox, const int &height, const int &width) {
    if (vecBbox.empty()) {
        cout << "Bbox is empty!!" << endl;
        return;
    }
    float bbw = 0, bbh = 0, maxSide = 0;
    float h = 0, w = 0;
    float x1 = 0, y1 = 0, x2 = 0, y2 = 0;
    for (vector<struct Bbox>::iterator it = vecBbox.begin(); it != vecBbox.end(); it++) {
        if ((*it).exist) {
            bbh = (*it).x2 - (*it).x1 + 1;
            bbw = (*it).y2 - (*it).y1 + 1;
            x1 = (*it).x1 + (*it).regreCoord[1] * bbh;
            y1 = (*it).y1 + (*it).regreCoord[0] * bbw;
            x2 = (*it).x2 + (*it).regreCoord[3] * bbh;
            y2 = (*it).y2 + (*it).regreCoord[2] * bbw;

            h = x2 - x1 + 1;
            w = y2 - y1 + 1;

            maxSide = (h > w) ? h : w;
            x1 = x1 + h * 0.5 - maxSide * 0.5;
            y1 = y1 + w * 0.5 - maxSide * 0.5;
            (*it).x2 = round(x1 + maxSide - 1);
            (*it).y2 = round(y1 + maxSide - 1);
            (*it).x1 = round(x1);
            (*it).y1 = round(y1);

            //boundary check
            if ((*it).x1 < 0)(*it).x1 = 0;
            if ((*it).y1 < 0)(*it).y1 = 0;
            if ((*it).x2 > height)(*it).x2 = height - 1;
            if ((*it).y2 > width)(*it).y2 = width - 1;

            it->area = (it->x2 - it->x1) * (it->y2 - it->y1);
        }
    }
}